

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinfl.h
# Opt level: O1

int sinfl_decompress(uchar *out,uchar *in,int size)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *in_1;
  bool bVar7;
  uchar nlens [19];
  uchar lens_1 [320];
  uchar lens [320];
  int local_1ee4;
  uint local_1d60;
  uint local_1d5c;
  
  pbVar1 = in + size;
  uVar4 = 0;
  memset(&local_1d60,0,0x1b28);
  uVar6 = 0;
  if (0 < (int)local_1d5c) {
    uVar6 = local_1d5c;
  }
  bVar7 = (int)local_1d5c < 0x10;
  local_1d5c = uVar6;
  if (0 < size && bVar7) {
    do {
      bVar2 = *in;
      in = in + 1;
      uVar4 = (uint)bVar2 << ((byte)uVar6 & 0x1f) | uVar4;
      local_1d5c = uVar6 + 8;
      local_1d60 = uVar4;
      if (7 < uVar6) break;
      uVar6 = local_1d5c;
    } while (in < pbVar1);
  }
  bVar7 = in < pbVar1;
  if (local_1d5c != 0 || bVar7) {
    do {
      local_1d60 = (int)local_1d60 >> 1;
      uVar6 = 1;
      if (1 < (int)local_1d5c) {
        uVar6 = local_1d5c;
      }
      bVar3 = (int)local_1d5c < 0x11;
      uVar4 = uVar6 - 1;
      local_1d5c = uVar6 - 1;
      if (bVar7 == true && bVar3) {
        do {
          bVar2 = *in;
          in = in + 1;
          local_1d60 = (uint)bVar2 << ((byte)uVar4 & 0x1f) | local_1d60;
          local_1d5c = uVar4 + 8;
          if (7 < uVar4) break;
          uVar4 = local_1d5c;
        } while (in < pbVar1);
      }
      uVar6 = local_1d60;
      local_1d60 = (int)local_1d60 >> 2;
      uVar4 = 2;
      if (2 < (int)local_1d5c) {
        uVar4 = local_1d5c;
      }
      bVar7 = (int)local_1d5c < 0x12;
      uVar5 = uVar4 - 2;
      local_1d5c = uVar4 - 2;
      if (bVar7) {
        do {
          local_1d5c = uVar5;
          if (pbVar1 <= in) break;
          bVar2 = *in;
          in = in + 1;
          local_1d60 = (uint)bVar2 << ((byte)uVar5 & 0x1f) | local_1d60;
          local_1d5c = uVar5 + 8;
          bVar7 = uVar5 < 8;
          uVar5 = local_1d5c;
        } while (bVar7);
      }
      bVar7 = true;
      switch(uVar6 & 3) {
      case 0:
        break;
      case 1:
        break;
      case 2:
        break;
      case 3:
        local_1ee4 = 0;
        bVar7 = false;
      }
      if (!bVar7) {
        return local_1ee4;
      }
      bVar7 = in < pbVar1;
    } while (local_1d5c != 0 || bVar7);
  }
  return 0;
}

Assistant:

static int
sinfl_decompress(unsigned char *out, const unsigned char *in, int size) {
  static const unsigned char order[] = {16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15};
  static const short dbase[30+2] = {1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,
      257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577};
  static const unsigned char dbits[30+2] = {0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,
      10,10,11,11,12,12,13,13,0,0};
  static const short lbase[29+2] = {3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,
      43,51,59,67,83,99,115,131,163,195,227,258,0,0};
  static const unsigned char lbits[29+2] = {0,0,0,0,0,0,0,0,1,1,1,1,2,2,2,2,3,3,3,3,4,
      4,4,4,5,5,5,5,0,0,0};

  const unsigned char *e = in + size, *o = out;
  enum sinfl_states {hdr,stored,fixed,dyn,blk};
  enum sinfl_states state = hdr;
  struct sinfl s = {0};
  int last = 0;

  sinfl_get(&in,e,&s,0); /* buffer input */
  while (in < e || s.bitcnt) {
    switch (state) {
    case hdr: {
      int type = 0; /* block header */
      last = sinfl_get(&in,e,&s,1);
      type = sinfl_get(&in,e,&s,2);

      switch (type) {default: return (int)(out-o);
      case 0x00: state = stored; break;
      case 0x01: state = fixed; break;
      case 0x02: state = dyn; break;}
    } break;
    case stored: {
      int len; /* uncompressed block */
      sinfl_get(&in,e,&s,s.bitcnt & 7);
      len = sinfl_get(&in,e,&s,16);
      //int nlen = sinfl_get(&in,e,&s,16);
      in -= 2; s.bitcnt = 0;

      if (len > (e-in) || !len)
        return (int)(out-o);
      memcpy(out, in, (size_t)len);
      in += len, out += len;
      state = hdr;
    } break;
    case fixed: {
      /* fixed huffman codes */
      int n; unsigned char lens[288+32];
      for (n = 0; n <= 143; n++) lens[n] = 8;
      for (n = 144; n <= 255; n++) lens[n] = 9;
      for (n = 256; n <= 279; n++) lens[n] = 7;
      for (n = 280; n <= 287; n++) lens[n] = 8;
      for (n = 0; n < 32; n++) lens[288+n] = 5;

      /* build lit/dist tables */
      sinfl_build(s.lits, lens, 10, 15, 288);
      sinfl_build(s.dsts, lens + 288, 8, 15, 32);
      state = blk;
    } break;
    case dyn: {
        /* dynamic huffman codes */
        int n, i;
        unsigned hlens[SINFL_PRE_TBL_SIZE];
        unsigned char nlens[19] = {0}, lens[288+32];
        int nlit = 257 + sinfl_get(&in,e,&s,5);
        int ndist = 1 + sinfl_get(&in,e,&s,5);
        int nlen = 4 + sinfl_get(&in,e,&s,4);
        for (n = 0; n < nlen; n++)
          nlens[order[n]] = (unsigned char)sinfl_get(&in,e,&s,3);
        sinfl_build(hlens, nlens, 7, 7, 19);

        /* decode code lengths */
        for (n = 0; n < nlit + ndist;) {
          int sym = sinfl_decode(&in, e, &s, hlens, 7);
          switch (sym) {default: lens[n++] = (unsigned char)sym; break;
          case 16: for (i=3+sinfl_get(&in,e,&s,2);i;i--,n++) lens[n]=lens[n-1]; break;
          case 17: for (i=3+sinfl_get(&in,e,&s,3);i;i--,n++) lens[n]=0; break;
          case 18: for (i=11+sinfl_get(&in,e,&s,7);i;i--,n++) lens[n]=0; break;}
        }
        /* build lit/dist tables */
        sinfl_build(s.lits, lens, 10, 15, nlit);
        sinfl_build(s.dsts, lens + nlit, 8, 15, ndist);
        state = blk;
    } break;
    case blk: {
      /* decompress block */
      int i, sym = sinfl_decode(&in, e, &s, s.lits, 10);
      if (sym > 256) {sym -= 257; /* match symbol */
        {int len = sinfl_get(&in, e, &s, lbits[sym]) + lbase[sym];
        int dsym = sinfl_decode(&in, e, &s, s.dsts, 8);
        int offs = sinfl_get(&in, e, &s, dbits[dsym]) + dbase[dsym];
        if (offs > (int)(out-o)) {
          return (int)(out-o);
        } else if (offs == 1) {
          /* rle match copying */
          unsigned char c = *(out - offs);
          unsigned long w = (c << 24) | (c << 16) | (c << 8) | c;
          for (i = 0; i < len >> 2; ++i) {
            memcpy(out, &w, 4);
            out += 4;
          }
          len = len & 3;
        } else if (offs >= 4) {
          /* copy match */
          int wcnt = len >> 2;
          for (i = 0; i < wcnt; ++i) {
            unsigned long w = 0;
            memcpy(&w, out - offs, 4);
            memcpy(out, &w, 4);
            out += 4;
          }
          len = len & 3;
        }
        for (i = 0; i < len; ++i)
          {*out = *(out-offs), out++;}
        }
      } else if (sym == 256) {
        /* end of block */
        if (last) return (int)(out-o);
        state = hdr;
        break;
        /* literal */
      } else *out++ = (unsigned char)sym;
    } break;}
  }
  return (int)(out-o);
}